

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# alter_table_info.cpp
# Opt level: O2

string * __thiscall
duckdb::RenameTableInfo::ToString_abi_cxx11_(string *__return_storage_ptr__,RenameTableInfo *this)

{
  string local_30;
  
  ::std::__cxx11::string::string
            ((string *)__return_storage_ptr__,anon_var_dwarf_4b0ffdd + 9,(allocator *)&local_30);
  ::std::__cxx11::string::append((char *)__return_storage_ptr__);
  if ((this->super_AlterTableInfo).super_AlterInfo.super_ParseInfo.field_0xa == '\x01') {
    ::std::__cxx11::string::append((char *)__return_storage_ptr__);
  }
  ParseInfo::QualifierToString
            (&local_30,&(this->super_AlterTableInfo).super_AlterInfo.catalog,
             &(this->super_AlterTableInfo).super_AlterInfo.schema,
             &(this->super_AlterTableInfo).super_AlterInfo.name);
  ::std::__cxx11::string::append((string *)__return_storage_ptr__);
  ::std::__cxx11::string::~string((string *)&local_30);
  ::std::__cxx11::string::append((char *)__return_storage_ptr__);
  KeywordHelper::WriteOptionallyQuoted(&local_30,&this->new_table_name,'\"',true);
  ::std::__cxx11::string::append((string *)__return_storage_ptr__);
  ::std::__cxx11::string::~string((string *)&local_30);
  ::std::__cxx11::string::append((char *)__return_storage_ptr__);
  return __return_storage_ptr__;
}

Assistant:

string RenameTableInfo::ToString() const {
	string result = "";
	result += "ALTER TABLE ";
	if (if_not_found == OnEntryNotFound::RETURN_NULL) {
		result += " IF EXISTS";
	}
	result += QualifierToString(catalog, schema, name);
	result += " RENAME TO ";
	result += KeywordHelper::WriteOptionallyQuoted(new_table_name);
	result += ";";
	return result;
}